

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall xercesc_4_0::AbstractDOMParser::notationDecl(AbstractDOMParser *this)

{
  XMLNotationDecl *in_RSI;
  
  notationDecl((AbstractDOMParser *)&this[-1].fBufMgr.fBufList,in_RSI,false);
  return;
}

Assistant:

void AbstractDOMParser::notationDecl
(
    const   XMLNotationDecl&    notDecl
    , const bool
)
{
    DOMNotationImpl* notation = (DOMNotationImpl *)fDocument->createNotation(notDecl.getName());
    notation->setPublicId(notDecl.getPublicId());
    notation->setSystemId(notDecl.getSystemId());
    notation->setBaseURI(notDecl.getBaseURI());

    DOMNode* rem = fDocumentType->getNotations()->setNamedItem( notation );
    if (rem)
        rem->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgNotationString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(notDecl.getName());

        bool publicKeywordPrinted = false;

        const XMLCh* id = notation->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

            publicKeywordPrinted = true;
        }
        id = notation->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);

            if ( !publicKeywordPrinted ){
				fInternalSubset.append(XMLUni::fgSysIDString);
				fInternalSubset.append(chSpace);
			}

            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        fInternalSubset.append(chCloseAngle);
    }
}